

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RemoveUnusedBrs.cpp
# Opt level: O2

void __thiscall
wasm::RemoveUnusedBrs::doWalkFunction(wasm::Function*)::FinalOptimizer::restructureIf(wasm::Block__
          (void *this,Block *curr)

{
  ExpressionList *this_00;
  Id IVar1;
  char *pcVar2;
  Expression *pEVar3;
  bool bVar4;
  Index IVar5;
  Nop *output;
  Expression **ppEVar6;
  Select *expression;
  Unary *condition;
  If *expression_00;
  char *in_RCX;
  Nop *output_2;
  Expression *pEVar7;
  Name target;
  EffectAnalyzer local_1c8;
  undefined1 local_58 [8];
  Nop nop;
  Builder local_40;
  char local_31;
  
  if ((curr->list).super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>.
      usedElements < 2) {
    __assert_fail("list.size() >= 2",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/passes/RemoveUnusedBrs.cpp"
                  ,0x413,
                  "void wasm::RemoveUnusedBrs::doWalkFunction(Function *)::FinalOptimizer::restructureIf(Block *)"
                 );
  }
  if ((curr->name).super_IString.str._M_str != (char *)0x0) {
    this_00 = &curr->list;
    ppEVar6 = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::operator[]
                        (&this_00->
                          super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>
                         ,0);
    IVar1 = (*ppEVar6)->_id;
    if (IVar1 == DropId) {
      pEVar7 = *(Expression **)(*ppEVar6 + 1);
    }
    else {
      ppEVar6 = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::operator[]
                          (&this_00->
                            super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>
                           ,0);
      pEVar7 = *ppEVar6;
    }
    if ((((pEVar7->_id == BreakId) &&
         (local_40.wasm = *(Module **)((long)this + 0xd0), pEVar7[2].type.id != 0)) &&
        (pcVar2 = (curr->name).super_IString.str._M_str, (char *)pEVar7[1].type.id == pcVar2)) &&
       (((pEVar7->type).id != 1 &&
        (target.super_IString.str._M_str = in_RCX, target.super_IString.str._M_len = (size_t)pcVar2,
        IVar5 = BranchUtils::BranchSeeker::count
                          ((BranchSeeker *)curr,(Expression *)(curr->name).super_IString.str._M_len,
                           target), IVar5 == 1)))) {
      if (IVar1 == DropId) {
        EffectAnalyzer::EffectAnalyzer
                  (&local_1c8,*(PassOptions **)((long)this + 0xe0),*(Module **)((long)this + 0xd0),
                   *(Expression **)(pEVar7 + 2));
        bVar4 = EffectAnalyzer::hasSideEffects(&local_1c8);
        EffectAnalyzer::~EffectAnalyzer(&local_1c8);
        if (bVar4) {
          ppEVar6 = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::operator[]
                              (&this_00->
                                super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>
                               ,0);
          nop.super_SpecificExpression<(wasm::Expression::Id)22>.super_Expression.type.id =
               (uintptr_t)*ppEVar6;
          local_58._0_4_ = NopId;
          nop.super_SpecificExpression<(wasm::Expression::Id)22>.super_Expression._id = InvalidId;
          nop.super_SpecificExpression<(wasm::Expression::Id)22>.super_Expression._4_4_ = 0;
          ppEVar6 = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::operator[]
                              (&this_00->
                                super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>
                               ,0);
          *ppEVar6 = (Expression *)local_58;
          local_31 = EffectAnalyzer::canReorder
                               (*(PassOptions **)((long)this + 0xe0),*(Module **)((long)this + 0xd0)
                                ,(Expression *)pEVar7[2].type.id,(Expression *)curr);
          EffectAnalyzer::EffectAnalyzer
                    (&local_1c8,*(PassOptions **)((long)this + 0xe0),*(Module **)((long)this + 0xd0)
                     ,(Expression *)curr);
          bVar4 = EffectAnalyzer::hasSideEffects(&local_1c8);
          EffectAnalyzer::~EffectAnalyzer(&local_1c8);
          ppEVar6 = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::operator[]
                              (&this_00->
                                super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>
                               ,0);
          *ppEVar6 = (Expression *)
                     nop.super_SpecificExpression<(wasm::Expression::Id)22>.super_Expression.type.id
          ;
          if (bVar4 || local_31 != '\x01') {
            return;
          }
          bVar4 = Properties::canEmitSelectWithArms(*(Expression **)(pEVar7 + 2),(Expression *)curr)
          ;
          if (!bVar4) {
            return;
          }
          ppEVar6 = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::operator[]
                              (&this_00->
                                super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>
                               ,0);
          pEVar3 = *ppEVar6;
          pEVar3->_id = NopId;
          (pEVar3->type).id = 0;
          expression = Builder::makeSelect(&local_40,(Expression *)pEVar7[2].type.id,
                                           *(Expression **)(pEVar7 + 2),(Expression *)curr);
        }
        else {
          bVar4 = EffectAnalyzer::canReorder
                            (*(PassOptions **)((long)this + 0xe0),*(Module **)((long)this + 0xd0),
                             (Expression *)pEVar7[2].type.id,*(Expression **)(pEVar7 + 2));
          if (!bVar4) {
            return;
          }
          ppEVar6 = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::operator[]
                              (&this_00->
                                super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>
                               ,0);
          pEVar3 = *ppEVar6;
          pEVar3->_id = NopId;
          (pEVar3->type).id = 0;
          expression = (Select *)
                       Builder::makeIf(&local_40,(Expression *)pEVar7[2].type.id,
                                       *(Expression **)(pEVar7 + 2),(Expression *)curr);
        }
        Walker<FinalOptimizer,_wasm::Visitor<FinalOptimizer,_void>_>::replaceCurrent
                  ((Walker<FinalOptimizer,_wasm::Visitor<FinalOptimizer,_void>_> *)this,
                   (Expression *)expression);
      }
      else {
        if (*(long *)(pEVar7 + 2) != 0) {
          __assert_fail("!br->value",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/passes/RemoveUnusedBrs.cpp"
                        ,0x426,
                        "void wasm::RemoveUnusedBrs::doWalkFunction(Function *)::FinalOptimizer::restructureIf(Block *)"
                       );
        }
        condition = Builder::makeUnary(&local_40,EqZInt32,(Expression *)pEVar7[2].type.id);
        expression_00 =
             Builder::makeIf(&local_40,(Expression *)condition,(Expression *)curr,(Expression *)0x0)
        ;
        Walker<FinalOptimizer,_wasm::Visitor<FinalOptimizer,_void>_>::replaceCurrent
                  ((Walker<FinalOptimizer,_wasm::Visitor<FinalOptimizer,_void>_> *)this,
                   (Expression *)expression_00);
        pEVar7->_id = NopId;
        (pEVar7->type).id = 0;
        Block::finalize(curr,(Type)(curr->super_SpecificExpression<(wasm::Expression::Id)1>).
                                   super_Expression.type.id);
      }
    }
  }
  return;
}

Assistant:

void restructureIf(Block* curr) {
        auto& list = curr->list;
        // We should be called only on potentially-interesting lists.
        assert(list.size() >= 2);
        if (curr->name.is()) {
          Break* br = nullptr;
          Drop* drop = list[0]->dynCast<Drop>();
          if (drop) {
            br = drop->value->dynCast<Break>();
          } else {
            br = list[0]->dynCast<Break>();
          }
          // Check if the br is conditional and goes to the block. It may or may
          // not have a value, depending on if it was dropped or not. If the
          // type is unreachable that means it is not actually reached, which we
          // can ignore.
          Builder builder(*getModule());
          if (br && br->condition && br->name == curr->name &&
              br->type != Type::unreachable) {
            if (BranchUtils::BranchSeeker::count(curr, curr->name) == 1) {
              // no other breaks to that name, so we can do this
              if (!drop) {
                assert(!br->value);
                replaceCurrent(builder.makeIf(
                  builder.makeUnary(EqZInt32, br->condition), curr));
                ExpressionManipulator::nop(br);
                curr->finalize(curr->type);
              } else {
                // To use an if, the value must have no side effects, as in the
                // if it may not execute.
                if (!EffectAnalyzer(passOptions, *getModule(), br->value)
                       .hasSideEffects()) {
                  // We also need to reorder the condition and the value.
                  if (EffectAnalyzer::canReorder(
                        passOptions, *getModule(), br->condition, br->value)) {
                    ExpressionManipulator::nop(list[0]);
                    replaceCurrent(
                      builder.makeIf(br->condition, br->value, curr));
                  }
                } else {
                  // The value has side effects, so it must always execute. We
                  // may still be able to optimize this, however, by using a
                  // select:
                  //   (block $x
                  //     (drop (br_if $x (value) (cond)))
                  //     ..., no other references to $x
                  //     ..final element..
                  //   )
                  // =>
                  //   (select
                  //     (value)
                  //     (block $x
                  //       ..., no other references to $x
                  //       ..final element..
                  //     )
                  //     (cond)
                  //   )
                  // To do this we must be able to reorder the condition with
                  // the rest of the block (but not the value), and we must be
                  // able to make the rest of the block always execute, so it
                  // must not have side effects.
                  // TODO: we can do this when there *are* other refs to $x,
                  //       with a larger refactoring here.

                  // Test for the conditions with a temporary nop instead of the
                  // br_if.
                  Expression* old = list[0];
                  Nop nop;
                  // After this assignment, curr is what is left in the block
                  // after ignoring the br_if.
                  list[0] = &nop;
                  auto canReorder = EffectAnalyzer::canReorder(
                    passOptions, *getModule(), br->condition, curr);
                  auto hasSideEffects =
                    EffectAnalyzer(passOptions, *getModule(), curr)
                      .hasSideEffects();
                  list[0] = old;
                  if (canReorder && !hasSideEffects &&
                      Properties::canEmitSelectWithArms(br->value, curr)) {
                    ExpressionManipulator::nop(list[0]);
                    replaceCurrent(
                      builder.makeSelect(br->condition, br->value, curr));
                  }
                }
              }
            }
          }
        }
      }